

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O3

void __thiscall
chrono::ChIterativeSolverVI::ArchiveOUT(ChIterativeSolverVI *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChIterativeSolverVI>(marchive);
  ChSolver::ArchiveOUT(&(this->super_ChSolverVI).super_ChSolver,marchive);
  local_30 = (double *)&(this->super_ChIterativeSolver).m_max_iterations;
  local_38 = "m_max_iterations";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_30 = (double *)&(this->super_ChIterativeSolver).m_warm_start;
  local_38 = "m_warm_start";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &(this->super_ChIterativeSolver).m_tolerance;
  local_38 = "m_tolerance";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->m_omega;
  local_38 = "m_omega";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->m_shlambda;
  local_38 = "m_shlambda";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChIterativeSolverVI::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChIterativeSolverVI>();
    // serialize parent class
    ChSolver::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(m_max_iterations);
    marchive << CHNVP(m_warm_start);
    marchive << CHNVP(m_tolerance);
    marchive << CHNVP(m_omega);
    marchive << CHNVP(m_shlambda);
}